

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

pointer __thiscall
QList<QWindowSystemInterfacePrivate::WindowSystemEvent_*>::data
          (QList<QWindowSystemInterfacePrivate::WindowSystemEvent_*> *this)

{
  QArrayDataPointer<QWindowSystemInterfacePrivate::WindowSystemEvent_*> *this_00;
  WindowSystemEvent **ppWVar1;
  QArrayDataPointer<QWindowSystemInterfacePrivate::WindowSystemEvent_*> *in_RDI;
  
  detach((QList<QWindowSystemInterfacePrivate::WindowSystemEvent_*> *)0x4476cc);
  this_00 = (QArrayDataPointer<QWindowSystemInterfacePrivate::WindowSystemEvent_*> *)
            QArrayDataPointer<QWindowSystemInterfacePrivate::WindowSystemEvent_*>::operator->
                      (in_RDI);
  ppWVar1 = QArrayDataPointer<QWindowSystemInterfacePrivate::WindowSystemEvent_*>::data(this_00);
  return ppWVar1;
}

Assistant:

pointer data() { detach(); return d->data(); }